

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.h
# Opt level: O1

void __thiscall sptk::StatisticsAccumulation::Buffer::~Buffer(Buffer *this)

{
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00111c90;
  pdVar1 = (this->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  SymmetricMatrix::~SymmetricMatrix(&this->second_order_statistics_);
  pdVar1 = (this->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Buffer() {
    }